

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.hpp
# Opt level: O2

ostream * detail::operator<<(ostream *os,print_hex_string *s)

{
  uint uVar1;
  _func_int *p_Var2;
  undefined1 uVar3;
  size_t i;
  ulong uVar4;
  
  p_Var2 = os->_vptr_basic_ostream[-3];
  uVar1 = *(uint *)(&os->field_0x18 + (long)p_Var2);
  uVar3 = std::ios::fill();
  (&os->field_0xe0)[(long)p_Var2] = 0x30;
  *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) =
       *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  for (uVar4 = 0; p_Var2 = os->_vptr_basic_ostream[-3], uVar4 < s->size; uVar4 = uVar4 + 1) {
    *(undefined8 *)(&os->field_0x10 + (long)p_Var2) = 2;
    std::ostream::operator<<(os,(uint)(byte)s->data[uVar4]);
  }
  std::ios::fill();
  (&os->field_0xe0)[(long)p_Var2] = uVar3;
  *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) =
       uVar1 & 0x4a | *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) & 0xffffffb5;
  return os;
}

Assistant:

inline std::ostream & operator<<(std::ostream & os, const print_hex_string & s) {
	
	std::ios_base::fmtflags old = os.flags();
	char oldfill = os.fill('0');
	
	os << std::hex;
	for(size_t i = 0; i < s.size; i++) {
		os << std::setw(2) << int(boost::uint8_t(s.data[i]));
	}
	
	os.fill(oldfill);
	os.setf(old, std::ios_base::basefield);
	return os;
}